

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCheckedActualCall_unExpectedParameterName_Test::
TEST_MockCheckedActualCall_unExpectedParameterName_Test
          (TEST_MockCheckedActualCall_unExpectedParameterName_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list = (MockExpectedCallsList *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).reporter = (MockFailureReporter *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).emptyList =
       (MockExpectedCallsList *)0x0;
  TEST_GROUP_CppUTestGroupMockCheckedActualCall::TEST_GROUP_CppUTestGroupMockCheckedActualCall
            (&this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall);
  (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002ba068;
  return;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedParameterName)
{
    MockCheckedExpectedCall call1;
    call1.withName("func");
    list->addExpectedCall(&call1);

    MockCheckedActualCall actualCall(1, reporter, *list);
    actualCall.withName("func").withParameter("integer", 1);

    MockNamedValue parameter("integer");
    parameter.setValue(1);

    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "func", parameter, *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}